

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order_book.cc
# Opt level: O0

uint64_t __thiscall helix::order_book::midprice(order_book *this,size_t level)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t ask;
  uint64_t bid;
  
  uVar1 = bid_price((order_book *)level,bid);
  uVar2 = ask_price((order_book *)level,bid);
  return uVar1 + uVar2 >> 1;
}

Assistant:

uint64_t order_book::midprice(size_t level) const
{
    auto bid = bid_price(level);
    auto ask = ask_price(level);
    return (bid + ask) / 2;
}